

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::DisableSoftConstraint::fromSyntax(DisableConstraintSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  RandMode RVar3;
  Compilation *compilation;
  NameSyntax *pNVar4;
  undefined4 extraout_var;
  DisableSoftConstraint *ctrl;
  Symbol *symbol;
  Constraint *pCVar5;
  Expression *args;
  
  compilation = ASTContext::getCompilation(context);
  pNVar4 = not_null<slang::syntax::NameSyntax_*>::get(&syntax->name);
  iVar2 = Expression::bind((int)pNVar4,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  ctrl = BumpAllocator::emplace<slang::ast::DisableSoftConstraint,slang::ast::Expression_const&>
                   (&compilation->super_BumpAllocator,args);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    symbol = Expression::getSymbolReference(args,true);
    if (symbol != (Symbol *)0x0) {
      RVar3 = ASTContext::getRandMode(context,symbol);
      if (RVar3 == Rand) {
        return &ctrl->super_Constraint;
      }
    }
    ASTContext::addDiag(context,(DiagCode)0x20008,args->sourceRange);
  }
  pCVar5 = Constraint::badConstraint(compilation,&ctrl->super_Constraint);
  return pCVar5;
}

Assistant:

Constraint& DisableSoftConstraint::fromSyntax(const DisableConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = Expression::bind(*syntax.name, context);
    auto result = comp.emplace<DisableSoftConstraint>(expr);
    if (expr.bad())
        return badConstraint(comp, result);

    auto sym = expr.getSymbolReference();
    if (!sym || context.getRandMode(*sym) != RandMode::Rand) {
        context.addDiag(diag::BadDisableSoft, expr.sourceRange);
        return badConstraint(comp, result);
    }

    return *result;
}